

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O0

int CfdGetPegoutAddress(void *handle,int mainchain_network,int elements_network,char *descriptor,
                       uint32_t bip32_counter,int address_type,char **mainchain_address,
                       char **base_descriptor)

{
  undefined1 uVar1;
  undefined8 uVar2;
  char *in_RCX;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  Address addr;
  Descriptor desc;
  AddressType addr_type;
  NetType elements_net_type;
  NetType mainchain_net_type;
  char *work_descriptor;
  char *work_address;
  int result;
  AddressType in_stack_00000868;
  uint32_t in_stack_0000086c;
  string *in_stack_00000870;
  NetType in_stack_00000878;
  NetType in_stack_0000087c;
  Descriptor *in_stack_00000890;
  Address *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  CfdError error_code;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  undefined7 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  string local_3e0;
  string local_3c0;
  allocator local_399;
  string local_398 [32];
  Address local_378;
  Descriptor local_200;
  AddressType local_98;
  NetType local_94;
  NetType local_90;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  char *local_40;
  char *local_38;
  undefined4 local_2c;
  char *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  local_2c = 0xffffffff;
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_20 = in_RCX;
  cfd::Initialize();
  uVar1 = cfd::capi::IsEmptyString(local_20);
  if (!(bool)uVar1) {
    local_90 = cfd::capi::ConvertNetType
                         (in_stack_fffffffffffffc14,
                          (bool *)CONCAT17(uVar1,in_stack_fffffffffffffc08));
    local_94 = cfd::capi::ConvertNetType
                         (in_stack_fffffffffffffc14,
                          (bool *)CONCAT17(uVar1,in_stack_fffffffffffffc08));
    local_98 = cfd::capi::ConvertAddressType(in_stack_fffffffffffffc14);
    cfd::core::Descriptor::Descriptor(&local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_398,local_20,&local_399);
    cfd::ElementsAddressFactory::CreatePegOutAddress
              (in_stack_0000087c,in_stack_00000878,in_stack_00000870,in_stack_0000086c,
               in_stack_00000868,in_stack_00000890);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    if (in_stack_00000008 != (undefined8 *)0x0) {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_3c0,&local_378);
      local_38 = cfd::capi::CreateString
                           ((string *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))
      ;
      std::__cxx11::string::~string((string *)&local_3c0);
    }
    if (in_stack_00000010 != (undefined8 *)0x0) {
      cfd::core::Descriptor::ToString_abi_cxx11_(&local_3e0,&local_200,false);
      local_40 = cfd::capi::CreateString
                           ((string *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))
      ;
      std::__cxx11::string::~string((string *)&local_3e0);
    }
    if (in_stack_00000010 != (undefined8 *)0x0) {
      *in_stack_00000010 = local_40;
    }
    if (in_stack_00000008 != (undefined8 *)0x0) {
      *in_stack_00000008 = local_38;
    }
    local_4 = 0;
    cfd::core::Address::~Address(in_stack_fffffffffffffbb0);
    cfd::core::Descriptor::~Descriptor((Descriptor *)0x5a2a25);
    return local_4;
  }
  local_68.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
               ,0x2f);
  local_68.filename = local_68.filename + 1;
  local_68.line = 0xf8;
  local_68.funcname = "CfdGetPegoutAddress";
  cfd::core::logger::warn<>(&local_68,"descriptor is null or empty.");
  local_8a = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,"Failed to parameter. descriptor is null or empty.",&local_89);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             error_code,in_stack_fffffffffffffbc0);
  local_8a = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPegoutAddress(
    void* handle, int mainchain_network, int elements_network,
    const char* descriptor, uint32_t bip32_counter, int address_type,
    char** mainchain_address, char** base_descriptor) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_descriptor = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(descriptor)) {
      warn(CFD_LOG_SOURCE, "descriptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor is null or empty.");
    }

    auto mainchain_net_type = ConvertNetType(mainchain_network, nullptr);
    auto elements_net_type = ConvertNetType(elements_network, nullptr);
    auto addr_type = ConvertAddressType(address_type);
    Descriptor desc;
    auto addr = ElementsAddressFactory::CreatePegOutAddress(
        mainchain_net_type, elements_net_type, descriptor, bip32_counter,
        addr_type, &desc);
    if (mainchain_address != nullptr) {
      work_address = CreateString(addr.GetAddress());
    }
    if (base_descriptor != nullptr) {
      work_descriptor = CreateString(desc.ToString(false));
    }

    if (base_descriptor != nullptr) *base_descriptor = work_descriptor;
    if (mainchain_address != nullptr) *mainchain_address = work_address;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_address, &work_descriptor);
  return result;
}